

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall ON_TextureMapping::IsValid(ON_TextureMapping *this,ON_TextLog *text_log)

{
  TYPE type_as_unsigned;
  PROJECTION projection_as_unsigned;
  TYPE TVar1;
  PROJECTION PVar2;
  ulong uVar3;
  char *format;
  
  type_as_unsigned = this->m_type;
  TVar1 = TypeFromUnsigned(type_as_unsigned);
  if (type_as_unsigned == TVar1) {
    projection_as_unsigned = this->m_projection;
    PVar2 = ProjectionFromUnsigned(projection_as_unsigned);
    if (projection_as_unsigned == PVar2) {
      if (this->m_texture_space < 2) {
        return true;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
                 ,0xabf,"","Invalid texture_space_as_unsigned value.");
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      uVar3 = (ulong)this->m_texture_space;
      format = "ON_TextureMapping m_texture_space = %d is not a valid value.\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      uVar3 = (ulong)this->m_projection;
      format = "ON_TextureMapping m_projection = %d is not a valid value.\n";
    }
  }
  else {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    uVar3 = (ulong)this->m_type;
    format = "ON_TextureMapping m_type = %d is not a valid value.\n";
  }
  ON_TextLog::Print(text_log,format,uVar3);
  return false;
}

Assistant:

bool ON_TextureMapping::IsValid( ON_TextLog* text_log ) const
{
  if ( m_type != ON_TextureMapping::TypeFromUnsigned( static_cast<unsigned int>(m_type) ) )
  {
    if ( text_log )
    {
      text_log->Print("ON_TextureMapping m_type = %d is not a valid value.\n",m_type);
    }
    return false;
  }

  if ( m_projection != ON_TextureMapping::ProjectionFromUnsigned( static_cast<unsigned int>(m_projection) ) )
  {
    if ( text_log )
    {
      text_log->Print("ON_TextureMapping m_projection = %d is not a valid value.\n",m_projection);
    }
    return false;
  }

  if (m_texture_space != ON_TextureMapping::TextureSpaceFromUnsigned( static_cast<unsigned int>(m_texture_space)))
  {
	  if (text_log)
	  {
		  text_log->Print("ON_TextureMapping m_texture_space = %d is not a valid value.\n",m_texture_space);
	  }
	  return false;
  }

  return true;
}